

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Vec_Int_t *
Abc_NtkFinCheckPair(Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,
                   Vec_Int_t *vNodes,int *iObjs,int *Types,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *local_80;
  int iVarBeg;
  int status;
  Vec_Int_t *vPat_1;
  int nConfLimit;
  int i;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vPat;
  Gia_Man_t *pGia;
  int *iObjs_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCis_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vTypes_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkFinMiterToGia(pNtk,vTypes,vCos,vCis,vNodes,iObjs,Types,vLits);
  iVar1 = Gia_ManAndNum(p);
  if (iVar1 == 0) {
    pGVar4 = Gia_ManCo(p,0);
    pGVar4 = Gia_ObjFanin0(pGVar4);
    iVar1 = Gia_ObjIsConst0(pGVar4);
    if (iVar1 != 0) {
      pGVar4 = Gia_ManCo(p,0);
      iVar1 = Gia_ObjFaninC0(pGVar4);
      if (iVar1 == 0) {
        local_80 = (Vec_Int_t *)0x0;
      }
      else {
        iVar1 = Vec_IntSize(vCis);
        local_80 = Vec_IntStart(iVar1);
      }
      Gia_ManStop(p);
      return local_80;
    }
  }
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Gia_ManStop(p);
    Cnf_DataFree(p_00);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    _iVarBeg = (Abc_Ntk_t *)0x0;
    iVar1 = p_00->nVars;
    iVar2 = Gia_ManPiNum(p);
    Gia_ManStop(p);
    Cnf_DataFree(p_00);
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
    if (iVar3 == 0) {
      _iVarBeg = (Abc_Ntk_t *)Vec_IntAlloc(0);
    }
    else if (iVar3 == 1) {
      iVar3 = Vec_IntSize(vCis);
      _iVarBeg = (Abc_Ntk_t *)Vec_IntAlloc(iVar3);
      for (vPat_1._4_4_ = 0; iVar3 = Vec_IntSize(vCis), vPat_1._4_4_ < iVar3;
          vPat_1._4_4_ = vPat_1._4_4_ + 1) {
        iVar3 = sat_solver_var_value(s,(iVar1 - iVar2) + vPat_1._4_4_);
        Vec_IntPush((Vec_Int_t *)_iVarBeg,iVar3);
      }
    }
    sat_solver_delete(s);
    pNtk_local = _iVarBeg;
  }
  return (Vec_Int_t *)pNtk_local;
}

Assistant:

Vec_Int_t * Abc_NtkFinCheckPair( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pGia = Abc_NtkFinMiterToGia( pNtk, vTypes, vCos, vCis, vNodes, iObjs, Types, vLits );
    if ( Gia_ManAndNum(pGia) == 0 && Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManCo(pGia, 0))) )
    {
        Vec_Int_t * vPat = Gia_ObjFaninC0(Gia_ManCo(pGia, 0)) ? Vec_IntStart(Vec_IntSize(vCis)) : NULL;
        Gia_ManStop( pGia );
        return vPat;
    }
    else
    {
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
        sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        if ( pSat == NULL )
        {
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            return NULL;
        }
        else
        {
            int i, nConfLimit = 10000;
            Vec_Int_t * vPat = NULL;
            int status, iVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
            //Gia_AigerWrite( pGia, "temp_detect.aig", 0, 0, 0 );
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
            if ( status == l_Undef )
                vPat = Vec_IntAlloc(0);
            else if ( status == l_True )
            {
                vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
                for ( i = 0; i < Vec_IntSize(vCis); i++ )
                    Vec_IntPush( vPat, sat_solver_var_value(pSat, iVarBeg+i) );
            }
            //printf( "%d ", sat_solver_nconflicts(pSat) );
            sat_solver_delete( pSat );
            return vPat;
        }
    }
}